

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

axis_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_axis_name
          (xpath_parser *this,xpath_lexer_string *name,bool *specified)

{
  bool bVar1;
  char_t *other;
  xpath_lexer_string *in_RDX;
  undefined8 *in_RSI;
  
  *(undefined1 *)&in_RDX->begin = 1;
  other = (char_t *)(ulong)((int)*(char *)*in_RSI - 0x61);
  switch(other) {
  case (char_t *)0x0:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_ancestor;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_ancestor_or_self;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_attribute;
    }
    break;
  default:
    break;
  case (char_t *)0x2:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_child;
    }
    break;
  case (char_t *)0x3:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_descendant;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_descendant_or_self;
    }
    break;
  case (char_t *)0x5:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_following;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_following_sibling;
    }
    break;
  case (char_t *)0xd:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_namespace;
    }
    break;
  case (char_t *)0xf:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_parent;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_preceding;
    }
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_preceding_sibling;
    }
    break;
  case (char_t *)0x12:
    bVar1 = xpath_lexer_string::operator==(in_RDX,other);
    if (bVar1) {
      return axis_self;
    }
  }
  *(undefined1 *)&in_RDX->begin = 0;
  return axis_child;
}

Assistant:

axis_t parse_axis_name(const xpath_lexer_string& name, bool& specified)
		{
			specified = true;

			switch (name.begin[0])
			{
			case 'a':
				if (name == PUGIXML_TEXT("ancestor"))
					return axis_ancestor;
				else if (name == PUGIXML_TEXT("ancestor-or-self"))
					return axis_ancestor_or_self;
				else if (name == PUGIXML_TEXT("attribute"))
					return axis_attribute;

				break;

			case 'c':
				if (name == PUGIXML_TEXT("child"))
					return axis_child;

				break;

			case 'd':
				if (name == PUGIXML_TEXT("descendant"))
					return axis_descendant;
				else if (name == PUGIXML_TEXT("descendant-or-self"))
					return axis_descendant_or_self;

				break;

			case 'f':
				if (name == PUGIXML_TEXT("following"))
					return axis_following;
				else if (name == PUGIXML_TEXT("following-sibling"))
					return axis_following_sibling;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("namespace"))
					return axis_namespace;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("parent"))
					return axis_parent;
				else if (name == PUGIXML_TEXT("preceding"))
					return axis_preceding;
				else if (name == PUGIXML_TEXT("preceding-sibling"))
					return axis_preceding_sibling;

				break;

			case 's':
				if (name == PUGIXML_TEXT("self"))
					return axis_self;

				break;

			default:
				break;
			}

			specified = false;
			return axis_child;
		}